

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O2

float get_threshold(float sum_loss,float t,float c0,float alpha)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  if (t < 3.0) {
    return 1.0;
  }
  fVar1 = ((sum_loss / t) * c0) / t;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar3 = alpha + alpha;
  if (fVar3 <= 4.0) {
    fVar3 = 4.0;
  }
  fVar2 = logf(t);
  return (fVar2 * fVar3 * c0) / t + fVar1;
}

Assistant:

float get_threshold(float sum_loss, float t, float c0, float alpha)
{
  if (t < 3.f)
  {
    return 1.f;
  }
  else
  {
    float avg_loss = sum_loss / t;
    float threshold = sqrt(c0 * avg_loss / t) + fmax(2.f * alpha, 4.f) * c0 * log(t) / t;
    return threshold;
  }
}